

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHelper.cc
# Opt level: O0

void OpenMesh::IO::write_float(float _f,FILE *_out,bool _swap)

{
  undefined4 local_20;
  undefined1 local_19;
  u3 fc;
  bool _swap_local;
  FILE *_out_local;
  float _f_local;
  
  local_20 = _f;
  local_19 = _swap;
  _fc = (FILE *)_out;
  _out_local._4_4_ = _f;
  if (_swap) {
    std::swap<unsigned_char>((uchar *)&local_20,(uchar *)((long)&local_20 + 3));
    std::swap<unsigned_char>((uchar *)((long)&local_20 + 1),(uchar *)((long)&local_20 + 2));
  }
  fwrite(&local_20,1,4,_fc);
  return;
}

Assistant:

void write_float(float _f, FILE* _out, bool _swap)
{
  union u3 { float f; unsigned char c[4]; } fc;
  fc.f = _f;
  if (_swap) {
    std::swap(fc.c[0], fc.c[3]);
    std::swap(fc.c[1], fc.c[2]);
  }
  fwrite((char*)fc.c, 1, 4, _out);
}